

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogleg.c
# Opt level: O2

void dogleg(int n,double *r,int lr,double *diag,double *qtb,double delta,double *x,double *wa1,
           double *wa2)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  
  dVar16 = dpmpar(1);
  uVar13 = n + 1;
  uVar4 = (long)(int)(uVar13 * n) / 2;
  uVar1 = uVar4 & 0xffffffff;
  iVar3 = (int)uVar4 + 1;
  lVar7 = (long)n;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  uVar11 = (ulong)((int)uVar4 + 1);
  iVar9 = -2;
  uVar14 = uVar13;
  for (uVar10 = 1; uVar10 != uVar11; uVar10 = uVar10 + 1) {
    lVar5 = lVar7 - uVar10;
    dVar21 = 0.0;
    if (lVar5 <= lVar7 + -2) {
      pdVar6 = r + (int)uVar1;
      for (lVar12 = (long)(int)uVar14; lVar12 <= lVar7; lVar12 = lVar12 + 1) {
        dVar21 = dVar21 + *pdVar6 * x[lVar12 + -1];
        pdVar6 = pdVar6 + 1;
      }
    }
    iVar3 = iVar3 - (int)uVar10;
    dVar22 = r[(long)iVar3 + -1];
    if ((dVar22 == 0.0) && (!NAN(dVar22))) {
      uVar2 = lVar5 + 1U & 0xffffffff;
      iVar8 = n + -1;
      for (lVar12 = 1; lVar12 <= (long)(lVar5 + 1U); lVar12 = lVar12 + 1) {
        uVar15 = -(ulong)(ABS(r[(long)(int)uVar2 + -1]) <= dVar22);
        dVar22 = (double)(uVar15 & (ulong)dVar22 | ~uVar15 & (ulong)ABS(r[(long)(int)uVar2 + -1]));
        uVar2 = (ulong)(uint)((int)uVar2 + iVar8);
        iVar8 = iVar8 + -1;
      }
      dVar22 = dVar22 * dVar16;
      if ((dVar22 == 0.0) && (!NAN(dVar22))) {
        dVar22 = dVar16;
      }
    }
    x[lVar5] = (qtb[lVar5] - dVar21) / dVar22;
    uVar14 = uVar14 - 1;
    uVar1 = (ulong)(uint)((int)uVar1 + iVar9);
    iVar9 = iVar9 + -1;
  }
  for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    wa1[uVar1] = 0.0;
    wa2[uVar1] = diag[uVar1] * x[uVar1];
  }
  dVar16 = enorm(n,wa2);
  if (delta < dVar16) {
    iVar3 = 1;
    pdVar6 = wa1;
    uVar14 = uVar13;
    iVar9 = n;
    iVar8 = n;
    for (uVar1 = 1; iVar9 = iVar9 + -1, uVar1 != uVar11; uVar1 = uVar1 + 1) {
      dVar21 = qtb[uVar1 - 1];
      for (lVar7 = 0; (long)(int)uVar14 - (long)iVar3 != lVar7; lVar7 = lVar7 + 1) {
        pdVar6[lVar7] = r[(long)iVar3 + lVar7 + -1] * dVar21 + pdVar6[lVar7];
      }
      wa1[uVar1 - 1] = wa1[uVar1 - 1] / diag[uVar1 - 1];
      uVar14 = uVar14 + iVar9;
      iVar3 = iVar3 + iVar8;
      iVar8 = iVar8 + -1;
      pdVar6 = pdVar6 + 1;
    }
    dVar21 = enorm(n,wa1);
    dVar23 = delta / dVar16;
    dVar22 = 0.0;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
        wa1[uVar1] = (wa1[uVar1] / dVar21) / diag[uVar1];
      }
      uVar2 = (ulong)uVar13;
      uVar1 = 1;
      pdVar6 = wa1;
      uVar10 = uVar1;
      for (; uVar2 = uVar2 - 1, uVar1 != uVar11; uVar1 = uVar1 + 1) {
        dVar22 = 0.0;
        for (uVar15 = 0; uVar2 != uVar15; uVar15 = uVar15 + 1) {
          dVar22 = dVar22 + r[(long)(int)uVar10 + (uVar15 - 1)] * pdVar6[uVar15];
        }
        uVar10 = (long)(int)uVar10 + (uVar2 & 0xffffffff);
        wa2[uVar1 - 1] = dVar22;
        pdVar6 = pdVar6 + 1;
      }
      dVar22 = enorm(n,wa2);
      dVar22 = (dVar21 / dVar22) / dVar22;
      if (delta <= dVar22) {
        dVar23 = 0.0;
      }
      else {
        dVar17 = enorm(n,qtb);
        auVar19._8_8_ = dVar17;
        auVar19._0_8_ = dVar22;
        auVar20._8_8_ = dVar21;
        auVar20._0_8_ = delta;
        auVar20 = divpd(auVar19,auVar20);
        dVar18 = auVar20._0_8_;
        dVar16 = auVar20._8_8_ * (dVar17 / dVar16) * dVar18;
        dVar21 = dVar16 - dVar23;
        dVar17 = 1.0 - dVar18 * dVar18;
        dVar21 = dVar21 * dVar21 + dVar17 * (1.0 - dVar23 * dVar23);
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        dVar23 = (dVar23 * dVar17) / (dVar21 + -dVar23 * dVar18 * dVar18 + dVar16);
      }
    }
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      x[uVar1] = wa1[uVar1] *
                 (double)(~-(ulong)(dVar22 <= delta) & (ulong)delta |
                         (ulong)dVar22 & -(ulong)(dVar22 <= delta)) * (1.0 - dVar23) +
                 x[uVar1] * dVar23;
    }
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(dogleg)(int n, const real *r, int lr, 
	const real *diag, const real *qtb, real delta, real *x, 
	real *wa1, real *wa2)
{
    /* System generated locals */
    real d1, d2, d3, d4;

    /* Local variables */
    int i, j, k, l, jj, jp1;
    real sum, temp, alpha, bnorm;
    real gnorm, qnorm, epsmch;
    real sgnorm;

/*     ********** */

/*     subroutine dogleg */

/*     given an m by n matrix a, an n by n nonsingular diagonal */
/*     matrix d, an m-vector b, and a positive number delta, the */
/*     problem is to determine the convex combination x of the */
/*     gauss-newton and scaled gradient directions that minimizes */
/*     (a*x - b) in the least squares sense, subject to the */
/*     restriction that the euclidean norm of d*x be at most delta. */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization of a. that is, if a = q*r, where q has */
/*     orthogonal columns and r is an upper triangular matrix, */
/*     then dogleg expects the full upper triangle of r and */
/*     the first n components of (q transpose)*b. */

/*     the subroutine statement is */

/*       subroutine dogleg(n,r,lr,diag,qtb,delta,x,wa1,wa2) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an input array of length lr which must contain the upper */
/*         triangular matrix r stored by rows. */

/*       lr is a positive integer input variable not less than */
/*         (n*(n+1))/2. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       delta is a positive input variable which specifies an upper */
/*         bound on the euclidean norm of d*x. */

/*       x is an output array of length n which contains the desired */
/*         convex combination of the gauss-newton direction and the */
/*         scaled gradient direction. */

/*       wa1 and wa2 are work arrays of length n. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa2;
    --wa1;
    --x;
    --qtb;
    --diag;
    --r;
    (void)lr;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

/*     first, calculate the gauss-newton direction. */

    jj = n * (n + 1) / 2 + 1;
    for (k = 1; k <= n; ++k) {
	j = n - k + 1;
	jp1 = j + 1;
	jj -= k;
	l = jj + 1;
	sum = 0.;
	if (n >= jp1) {
            for (i = jp1; i <= n; ++i) {
                sum += r[l] * x[i];
                ++l;
            }
        }
	temp = r[jj];
	if (temp == 0.) {
            l = j;
            for (i = 1; i <= j; ++i) {
                /* Computing MAX */
                d2 = fabs(r[l]);
                temp = max(temp,d2);
                l = l + n - i;
            }
            temp = epsmch * temp;
            if (temp == 0.) {
                temp = epsmch;
            }
        }
	x[j] = (qtb[j] - sum) / temp;
    }

/*     test whether the gauss-newton direction is acceptable. */

    for (j = 1; j <= n; ++j) {
	wa1[j] = 0.;
	wa2[j] = diag[j] * x[j];
    }
    qnorm = __cminpack_func__(enorm)(n, &wa2[1]);
    if (qnorm <= delta) {
        return;
    }

/*     the gauss-newton direction is not acceptable. */
/*     next, calculate the scaled gradient direction. */

    l = 1;
    for (j = 1; j <= n; ++j) {
	temp = qtb[j];
	for (i = j; i <= n; ++i) {
	    wa1[i] += r[l] * temp;
	    ++l;
	}
	wa1[j] /= diag[j];
    }

/*     calculate the norm of the scaled gradient and test for */
/*     the special case in which the scaled gradient is zero. */

    gnorm = __cminpack_func__(enorm)(n, &wa1[1]);
    sgnorm = 0.;
    alpha = delta / qnorm;
    if (gnorm != 0.) {

/*     calculate the point along the scaled gradient */
/*     at which the quadratic is minimized. */

        for (j = 1; j <= n; ++j) {
            wa1[j] = wa1[j] / gnorm / diag[j];
        }
        l = 1;
        for (j = 1; j <= n; ++j) {
            sum = 0.;
            for (i = j; i <= n; ++i) {
                sum += r[l] * wa1[i];
                ++l;
            }
            wa2[j] = sum;
        }
        temp = __cminpack_func__(enorm)(n, &wa2[1]);
        sgnorm = gnorm / temp / temp;

/*     test whether the scaled gradient direction is acceptable. */

        alpha = 0.;
        if (sgnorm < delta) {

/*     the scaled gradient direction is not acceptable. */
/*     finally, calculate the point along the dogleg */
/*     at which the quadratic is minimized. */

            bnorm = __cminpack_func__(enorm)(n, &qtb[1]);
            temp = bnorm / gnorm * (bnorm / qnorm) * (sgnorm / delta);
            /* Computing 2nd power */
            d1 = sgnorm / delta;
            /* Computing 2nd power */
            d2 = temp - delta / qnorm;
            /* Computing 2nd power */
            d3 = delta / qnorm;
            /* Computing 2nd power */
            d4 = sgnorm / delta;
            temp = temp - delta / qnorm * (d1 * d1)
                   + sqrt(d2 * d2
                          + (1 - d3 * d3) * (1 - d4 * d4));
            /* Computing 2nd power */
            d1 = sgnorm / delta;
            alpha = delta / qnorm * (1 - d1 * d1) / temp;
        }
    }

/*     form appropriate convex combination of the gauss-newton */
/*     direction and the scaled gradient direction. */

    temp = (1 - alpha) * min(sgnorm,delta);
    for (j = 1; j <= n; ++j) {
	x[j] = temp * wa1[j] + alpha * x[j];
    }

/*     last card of subroutine dogleg. */

}